

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O1

Result __thiscall Kernel::QKbo::compare(QKbo *this,Literal *l1,Literal *l2)

{
  ulong uVar1;
  ulong uVar2;
  Term *this_00;
  bool bVar3;
  bool bVar4;
  Result RVar5;
  TermList s;
  TermList t;
  uint n;
  uint f;
  undefined1 in_stack_00000060 [24];
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  a2_;
  Term *local_c0;
  Term *local_b8;
  uint local_ac;
  undefined1 local_a8 [32];
  Term *local_88;
  undefined1 local_80 [32];
  Term **local_60;
  Term **ppTStack_58;
  QKbo *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QKbo *local_38;
  
  if (l1 == l2) {
    RVar5 = EQUAL;
  }
  else {
    local_a8._0_4_ = (l1->super_Term)._functor;
    bVar4 = true;
    bVar3 = true;
    local_c0 = &l2->super_Term;
    local_b8 = &l1->super_Term;
    if (local_a8._0_4_ != 0) {
      bVar3 = forAnyNumTraits<Kernel::AlascaState::interpretedPred(Kernel::Literal*)::_lambda(auto:1)_1_>
                        ((anon_class_8_1_54a39806)local_a8);
    }
    local_a8._0_4_ = local_c0->_functor;
    if (local_a8._0_4_ != 0) {
      bVar4 = forAnyNumTraits<Kernel::AlascaState::interpretedPred(Kernel::Literal*)::_lambda(auto:1)_1_>
                        ((anon_class_8_1_54a39806)local_a8);
    }
    RVar5 = LESS;
    if (((byte)(bVar3 ^ 1U | bVar4) == 1) && (RVar5 = GREATER, (byte)(bVar4 ^ 1U | bVar3) == 1)) {
      if (bVar3 == false && bVar4 == false) {
        RVar5 = PrecedenceOrdering::comparePredicatePrecedences
                          (&(this->_kbo).super_PrecedenceOrdering,local_b8->_functor,
                           local_c0->_functor);
        if (RVar5 == EQUAL) {
          local_88 = local_b8;
          local_ac = Term::numTermArguments(local_b8);
          this_00 = local_c0;
          Term::numTermArguments(local_c0);
          n = 0;
          do {
            if (local_ac == n) {
              RVar5 = EQUAL;
              break;
            }
            s = Term::termArg(local_88,n);
            t = Term::termArg(this_00,n);
            RVar5 = compare(this,s,t);
            n = n + 1;
          } while (RVar5 == EQUAL);
          if (RVar5 == EQUAL) {
            uVar1 = local_b8->_args[0]._content;
            uVar2 = local_c0->_args[0]._content;
            if ((((uVar2 & 4) != 0) || (RVar5 = LESS, (uVar1 & 4) == 0)) &&
               (((uVar1 & 4) != 0 || (RVar5 = GREATER, (uVar2 & 4) == 0)))) {
              RVar5 = (((uVar1 & 4) == 0) != ((uVar2 & 4) == 0)) + EQUAL;
            }
          }
        }
      }
      else {
        atomsWithLvl((Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                      *)local_a8,this,(Literal *)local_b8);
        atomsWithLvl((Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                      *)local_80,this,(Literal *)local_c0);
        RVar5 = INCOMPARABLE;
        if ((local_a8[0] == true) && (local_80[0] != false)) {
          local_48 = local_a8 + 8;
          puStack_40 = local_80 + 8;
          local_60 = &local_b8;
          ppTStack_58 = &local_c0;
          local_50 = this;
          local_38 = this;
          RVar5 = OrderingUtils::
                  lexProductCapture<Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__4,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__0>
                            ((anon_class_24_3_028f1164)in_stack_00000060,
                             (anon_class_24_3_02943ac4)
                             a2_.
                             super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                             ._0_24_);
        }
        if (local_80[0] == true) {
          ::Lib::
          Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)(local_80 + 0x10));
        }
        if (local_a8[0] == true) {
          ::Lib::
          Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)(local_a8 + 0x10));
        }
      }
    }
  }
  return RVar5;
}

Assistant:

QKbo::Result QKbo::compare(Literal* l1, Literal* l2) const 
{
  if (l1 == l2) 
    return Result::EQUAL;

  auto i1 = AlascaState::interpretedPred(l1);
  auto i2 = AlascaState::interpretedPred(l2);
       if ( i1 && !i2) return Result::LESS;
  else if (!i1 &&  i2) return Result::GREATER;
  else if (!i1 && !i2) return TIME_TRACE_EXPR("uninterpreted", OU::lexProductCapture(
        [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
      , [&]() { return OU::lexExt(termArgIter(l1), termArgIter(l2), this->asClosure()); }
      , [&]() { return OU::stdCompare(l1->isNegative(), l2->isNegative()); }
    ));
  else {
    ASS(i1 && i2)
   
    auto a1_ = atomsWithLvl(l1);
    auto a2_ = atomsWithLvl(l2);
    if (!a1_.isSome() || !a2_.isSome())
      return Result::INCOMPARABLE;
    auto& a1 = a1_.unwrap();
    auto& a2 = a2_.unwrap();
    return OU::lexProductCapture(
        [&]() -> Ordering::Result { 
        TIME_TRACE("atoms with levels")
        return OU::weightedMulExt(*std::get<0>(a1), *std::get<0>(a2), 
                          [&](auto const& l, auto const& r)
                          { return OU::lexProductCapture(
                              [&]() { return this->compare(l.term, r.term); }
                            , [&]() { return OU::stdCompare(std::get<1>(a1),std::get<1>(a2)); }
                          );}); }
      , [&]() {
        // the atoms of the two literals are the same. 
        // This means they must be of the same sort
        auto sort =  SortHelper::getTermArgSort(l1,0);
        ASS_EQ(sort, SortHelper::getTermArgSort(l2,0));
        ASS_EQ(l1->isEquality() && l1->isPositive(), l2->isEquality() && l2->isPositive())
        return tryNumTraits([&](auto numTraits) {
          using NumTraits = decltype(numTraits);
          if (NumTraits::sort() != sort) {
            return Option<Ordering::Result>();
          } else {
            if (l1->isEquality() && l2->isEquality()) {
              TIME_TRACE("compare equalities")
              ASS_EQ(l1->isPositive(), l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  // TODO make use of the constant size of the multiset
                  [&]() { 
                    auto e1 = nfEquality<NumTraits>(l1);
                    auto e2 = nfEquality<NumTraits>(l2);
                    return OU::mulExt(*e1, *e2, this->asClosure()); }
                , [&]() { 
                  Recycled<MultiSet<TermList>> m1; m1->init(l1->termArg(0), l1->termArg(1));
                  Recycled<MultiSet<TermList>> m2; m2->init(l2->termArg(0), l2->termArg(1));
                  // TODO make use of the constant size of the multiset
                  return OU::mulExt(*m1,*m2,this->asClosure()); }
              ));
            } else if ( l1->isEquality() && !l2->isEquality()) {
              ASS(l1->isNegative())
              return Option<Ordering::Result>(Result::LESS);
            } else if (!l1->isEquality() &&  l2->isEquality()) {
              ASS(l2->isNegative())
              return Option<Ordering::Result>(Result::GREATER);
            } else if (l1->functor() == NumTraits::isIntF()) {
              ASS_EQ(l2->functor(), NumTraits::isIntF())
              ASS_EQ(l2->isPositive(), l1->isPositive())
              return some(this->compare(l1->termArg(0), l2->termArg(0)));
            } else {
              TIME_TRACE("compare inequqlities")
              ASS(l1->functor() == numTraits.greaterF() || l1->functor() == numTraits.geqF())
              ASS(l2->functor() == numTraits.greaterF() || l2->functor() == numTraits.geqF())
              ASS(l1->isPositive())
              ASS(l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  [&]() { return this->compare(l1->termArg(0), l2->termArg(0)); }
                , [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
              ));
            } 
          } 
        }) || [&]() {
          ASS_EQ(l1->isPositive(), l2->isPositive())
          // uninterpreted sort
          return Result::EQUAL;
        };
      }
    );
  }
}